

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZGeoElSidePartition>::Resize
          (TPZVec<TPZGeoElSidePartition> *this,int64_t newsize,TPZGeoElSidePartition *object)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  int64_t *piVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  TPZGeoElSidePartition *pTVar10;
  TPZGeoElSidePartition *pTVar11;
  
  if (newsize < 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ostream::flush();
    return;
  }
  lVar8 = this->fNElements;
  if (lVar8 != newsize) {
    if (newsize == 0) {
      pTVar11 = (TPZGeoElSidePartition *)0x0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = newsize;
      uVar3 = SUB168(auVar2 * ZEXT816(0x38),0);
      uVar4 = uVar3 + 8;
      if (0xfffffffffffffff7 < uVar3) {
        uVar4 = 0xffffffffffffffff;
      }
      uVar3 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x38),8) == 0) {
        uVar3 = uVar4;
      }
      piVar5 = (int64_t *)operator_new__(uVar3);
      *piVar5 = newsize;
      pTVar11 = (TPZGeoElSidePartition *)(piVar5 + 1);
      lVar7 = 0;
      do {
        *(undefined ***)((long)piVar5 + lVar7 + 8) = &PTR__TPZGeoElSide_0172da80;
        *(undefined8 *)((long)piVar5 + lVar7 + 0x10) = 0;
        *(undefined4 *)((long)piVar5 + lVar7 + 0x18) = 0xffffffff;
        *(undefined ***)((long)piVar5 + lVar7 + 0x20) = &PTR__TPZVec_0172e6d0;
        *(undefined8 *)((long)piVar5 + lVar7 + 0x38) = 0;
        puVar1 = (undefined8 *)((long)piVar5 + lVar7 + 0x28);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar7 = lVar7 + 0x38;
      } while (newsize * 0x38 - lVar7 != 0);
    }
    if (newsize <= lVar8) {
      lVar8 = newsize;
    }
    lVar9 = 0;
    lVar7 = lVar8;
    if (lVar8 < 1) {
      lVar8 = lVar9;
      lVar7 = lVar9;
    }
    while (lVar8 != 0) {
      TPZGeoElSidePartition::operator=
                ((TPZGeoElSidePartition *)
                 ((long)&(pTVar11->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar9),
                 (TPZGeoElSidePartition *)
                 ((long)&(this->fStore->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar9));
      lVar9 = lVar9 + 0x38;
      lVar8 = lVar8 + -1;
    }
    pTVar10 = pTVar11 + lVar7;
    for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
      TPZGeoElSidePartition::operator=(pTVar10,object);
      pTVar10 = pTVar10 + 1;
    }
    pTVar10 = this->fStore;
    if (pTVar10 != (TPZGeoElSidePartition *)0x0) {
      lVar8 = pTVar10[-1].fPartition.fNAlloc;
      if (lVar8 != 0) {
        lVar7 = lVar8 * 0x38;
        do {
          ~TPZVec((TPZVec<TPZGeoElSidePartition> *)((long)pTVar10 + lVar7 + -0x20));
          lVar7 = lVar7 + -0x38;
        } while (lVar7 != 0);
      }
      operator_delete__(&pTVar10[-1].fPartition.fNAlloc,lVar8 * 0x38 + 8);
    }
    this->fStore = pTVar11;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}